

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageModule.cpp
# Opt level: O1

Message * __thiscall
ki::protocol::dml::MessageModule::create_message(MessageModule *this,uint8_t message_type)

{
  MessageTemplate *this_00;
  Message *pMVar1;
  ostream *poVar2;
  value_error *this_01;
  ostringstream oss;
  uint8_t local_1b1;
  string local_1b0;
  ostringstream local_190 [376];
  
  this_00 = get_message_template(this,message_type);
  if (this_00 != (MessageTemplate *)0x0) {
    pMVar1 = MessageTemplate::create_message(this_00);
    return pMVar1;
  }
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"No message exists with type: ",0x1d);
  local_1b1 = message_type;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,(char *)&local_1b1,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"(service=",9);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_190,(this->m_protocol_type)._M_dataplus._M_p,
                      (this->m_protocol_type)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
  this_01 = (value_error *)__cxa_allocate_exception(0x18);
  std::__cxx11::stringbuf::str();
  value_error::value_error(this_01,&local_1b0,DML_INVALID_MESSAGE_TYPE);
  __cxa_throw(this_01,&value_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Message *MessageModule::create_message(uint8_t message_type) const
	{
		auto *message_template = get_message_template(message_type);
		if (!message_template)
		{
			std::ostringstream oss;
			oss << "No message exists with type: " << message_type;
			oss << "(service=" << m_protocol_type << ")";
			throw value_error(oss.str(), value_error::DML_INVALID_MESSAGE_TYPE);
		}

		return message_template->create_message();
	}